

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_opengl.c
# Opt level: O3

void load_extensions(MOJOSHADER_glGetProcAddress lookup,void *d)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  GLenum GVar4;
  StringCache *cache;
  GLubyte *pGVar5;
  char *pcVar6;
  byte *str;
  MOJOSHADER_glContext *pMVar7;
  long lVar8;
  int *piVar9;
  GLuint GVar10;
  byte *pbVar11;
  byte bVar12;
  ulong uVar13;
  GLint num_exts;
  GLint local_2c;
  
  cache = stringcache_create(ctx->malloc_fn,ctx->free_fn,ctx->malloc_data);
  pMVar7 = ctx;
  if (cache == (StringCache *)0x0) {
    builtin_strncpy(error_buffer,"out of memory",0xe);
    return;
  }
  pMVar7->have_core_opengl = 1;
  pMVar7->have_opengl_2 = 1;
  pMVar7->have_opengl_3 = 1;
  pMVar7->have_GL_ARB_vertex_program = 1;
  pMVar7->have_GL_ARB_fragment_program = 1;
  pMVar7->have_GL_NV_vertex_program2_option = 1;
  pMVar7->have_GL_NV_fragment_program2 = 1;
  pMVar7->have_GL_NV_vertex_program3 = 1;
  pMVar7->have_GL_NV_gpu_program4 = 1;
  pMVar7->have_GL_ARB_shader_objects = 1;
  pMVar7->have_GL_ARB_vertex_shader = 1;
  pMVar7->have_GL_ARB_fragment_shader = 1;
  pMVar7->have_GL_ARB_shading_language_100 = 1;
  pMVar7->have_GL_NV_half_float = 1;
  pMVar7->have_GL_ARB_half_float_vertex = 1;
  pMVar7->have_GL_OES_vertex_half_float = 1;
  pMVar7->have_GL_ARB_instanced_arrays = 1;
  lookup_entry_points(lookup,d);
  if (ctx->have_core_opengl == 0) {
    builtin_strncpy(error_buffer,"missing basic OpenGL entry points",0x22);
    goto LAB_00124e0d;
  }
  pGVar5 = (*ctx->glGetString)(0x1f02);
  pcVar6 = strstr((char *)pGVar5,"OpenGL ES ");
  pMVar7 = ctx;
  if (pcVar6 == (char *)0x0) {
    piVar1 = &ctx->opengl_major;
    if (pGVar5 != (GLubyte *)0x0) goto LAB_00124c9b;
    ctx->opengl_minor = 0;
    *piVar1 = 0;
  }
  else {
    ctx->have_opengl_es = 1;
    pGVar5 = pGVar5 + 10;
LAB_00124c9b:
    __isoc99_sscanf(pGVar5,"%d.%d",&pMVar7->opengl_major,&pMVar7->opengl_minor);
    pMVar7 = ctx;
  }
  if ((pMVar7->have_opengl_3 == 0) ||
     ((int)((uint)(ushort)pMVar7->opengl_minor | pMVar7->opengl_major << 0x10) < 0x30000)) {
    str = (*pMVar7->glGetString)(0x1f03);
    ctx->have_opengl_3 = 0;
    while ((uVar13 = (ulong)*str, uVar13 < 0x21 && ((0x100002600U >> (uVar13 & 0x3f) & 1) != 0))) {
      str = str + 1;
    }
    while( true ) {
      lVar8 = 0;
      pbVar11 = str;
      while( true ) {
        pbVar11 = pbVar11 + 1;
        bVar12 = (byte)uVar13;
        if ((bVar12 == 0) || ((bVar12 < 0x21 && ((0x100002600U >> (uVar13 & 0x3f) & 1) != 0))))
        break;
        uVar13 = (ulong)str[lVar8 + 1];
        lVar8 = lVar8 + 1;
      }
      if ((lVar8 != 0) &&
         (pcVar6 = stringcache_len(cache,(char *)str,(uint)lVar8), pcVar6 == (char *)0x0)) break;
      if (bVar12 == 0) goto LAB_00124e0d;
      while ((uVar13 = (ulong)*pbVar11, str = pbVar11, uVar13 < 0x21 &&
             ((0x100002600U >> (uVar13 & 0x3f) & 1) != 0))) {
        pbVar11 = pbVar11 + 1;
      }
    }
    builtin_strncpy(error_buffer + 8,"emory",6);
    builtin_strncpy(error_buffer,"out of m",8);
  }
  else {
    local_2c = 0;
    (*pMVar7->glGetIntegerv)(0x821d,&local_2c);
    if (0 < local_2c) {
      GVar10 = 0;
      do {
        pGVar5 = (*ctx->glGetStringi)(0x1f03,GVar10);
        pcVar6 = stringcache(cache,(char *)pGVar5);
        if (pcVar6 == (char *)0x0) {
          builtin_strncpy(error_buffer + 8,"emory",6);
          builtin_strncpy(error_buffer,"out of m",8);
        }
        GVar10 = GVar10 + 1;
      } while ((int)GVar10 < local_2c);
    }
  }
LAB_00124e0d:
  pMVar7 = ctx;
  if ((ctx->have_opengl_2 != 0) &&
     ((int)((uint)(ushort)ctx->opengl_minor | ctx->opengl_major << 0x10) < 0x20000)) {
    ctx->have_opengl_2 = 0;
    pMVar7->glUniform1i = pMVar7->glUniform1iARB;
    pMVar7->glUniform4fv = pMVar7->glUniform4fvARB;
    pMVar7->glUniform4iv = pMVar7->glUniform4ivARB;
    pMVar7->glDisableVertexAttribArray = pMVar7->glDisableVertexAttribArrayARB;
    pMVar7->glEnableVertexAttribArray = pMVar7->glEnableVertexAttribArrayARB;
    pMVar7->glVertexAttribPointer = pMVar7->glVertexAttribPointerARB;
  }
  if (pMVar7->have_GL_ARB_vertex_program == 0) {
    iVar2 = 0;
  }
  else {
    iVar2 = 0;
    if (pMVar7->have_core_opengl != 0) {
      iVar2 = stringcache_iscached(cache,"GL_ARB_vertex_program");
      pMVar7 = ctx;
    }
  }
  pMVar7->have_GL_ARB_vertex_program = iVar2;
  iVar2 = 0;
  if ((pMVar7->have_GL_ARB_fragment_program != 0) && (iVar2 = 0, pMVar7->have_core_opengl != 0)) {
    iVar2 = stringcache_iscached(cache,"GL_ARB_fragment_program");
    pMVar7 = ctx;
  }
  pMVar7->have_GL_ARB_fragment_program = iVar2;
  iVar2 = 0;
  if (pMVar7->have_GL_ARB_shader_objects == 0) {
    iVar3 = 0;
  }
  else {
    iVar3 = 0;
    if (pMVar7->have_core_opengl != 0) {
      iVar3 = stringcache_iscached(cache,"GL_ARB_shader_objects");
      pMVar7 = ctx;
    }
  }
  pMVar7->have_GL_ARB_shader_objects = iVar3;
  if ((pMVar7->have_GL_ARB_vertex_shader != 0) && (pMVar7->have_core_opengl != 0)) {
    iVar2 = stringcache_iscached(cache,"GL_ARB_vertex_shader");
    pMVar7 = ctx;
  }
  pMVar7->have_GL_ARB_vertex_shader = iVar2;
  iVar2 = 0;
  if (pMVar7->have_GL_ARB_fragment_shader == 0) {
    iVar3 = 0;
  }
  else {
    iVar3 = 0;
    if (pMVar7->have_core_opengl != 0) {
      iVar3 = stringcache_iscached(cache,"GL_ARB_fragment_shader");
      pMVar7 = ctx;
    }
  }
  pMVar7->have_GL_ARB_fragment_shader = iVar3;
  if ((pMVar7->have_GL_ARB_shading_language_100 != 0) && (pMVar7->have_core_opengl != 0)) {
    iVar2 = stringcache_iscached(cache,"GL_ARB_shading_language_100");
    pMVar7 = ctx;
  }
  pMVar7->have_GL_ARB_shading_language_100 = iVar2;
  iVar2 = 0;
  if (pMVar7->have_GL_NV_vertex_program2_option == 0) {
    iVar3 = 0;
  }
  else {
    iVar3 = 0;
    if (pMVar7->have_core_opengl != 0) {
      iVar3 = stringcache_iscached(cache,"GL_NV_vertex_program2_option");
      pMVar7 = ctx;
    }
  }
  pMVar7->have_GL_NV_vertex_program2_option = iVar3;
  if ((pMVar7->have_GL_NV_fragment_program2 != 0) && (pMVar7->have_core_opengl != 0)) {
    iVar2 = stringcache_iscached(cache,"GL_NV_fragment_program2");
    pMVar7 = ctx;
  }
  pMVar7->have_GL_NV_fragment_program2 = iVar2;
  iVar2 = 0;
  if (pMVar7->have_GL_NV_vertex_program3 == 0) {
    iVar3 = 0;
  }
  else {
    iVar3 = 0;
    if (pMVar7->have_core_opengl != 0) {
      iVar3 = stringcache_iscached(cache,"GL_NV_vertex_program3");
      pMVar7 = ctx;
    }
  }
  pMVar7->have_GL_NV_vertex_program3 = iVar3;
  if ((pMVar7->have_GL_NV_half_float != 0) && (pMVar7->have_core_opengl != 0)) {
    iVar2 = stringcache_iscached(cache,"GL_NV_half_float");
    pMVar7 = ctx;
  }
  pMVar7->have_GL_NV_half_float = iVar2;
  iVar3 = 0;
  iVar2 = verify_extension("GL_ARB_half_float_vertex",pMVar7->have_GL_ARB_half_float_vertex,cache,3,
                           0);
  pMVar7 = ctx;
  ctx->have_GL_ARB_half_float_vertex = iVar2;
  if ((pMVar7->have_GL_OES_vertex_half_float != 0) && (pMVar7->have_core_opengl != 0)) {
    iVar3 = stringcache_iscached(cache,"GL_OES_vertex_half_float");
    pMVar7 = ctx;
  }
  pMVar7->have_GL_OES_vertex_half_float = iVar3;
  iVar2 = verify_extension("GL_ARB_instanced_arrays",pMVar7->have_GL_ARB_instanced_arrays,cache,3,3)
  ;
  ctx->have_GL_ARB_instanced_arrays = iVar2;
  stringcache_destroy(cache);
  pMVar7 = ctx;
  pMVar7->glsl_major = 0;
  pMVar7->glsl_minor = 0;
  if ((pMVar7->have_core_opengl != 0) &&
     ((pMVar7->have_opengl_2 != 0 ||
      ((((pMVar7->have_GL_ARB_shader_objects != 0 && (pMVar7->have_GL_ARB_vertex_shader != 0)) &&
        (pMVar7->have_GL_ARB_fragment_shader != 0)) &&
       (pMVar7->have_GL_ARB_shading_language_100 != 0)))))) {
    (*pMVar7->glGetError)();
    pGVar5 = (*ctx->glGetString)(0x8b8c);
    GVar4 = (*ctx->glGetError)();
    piVar1 = &ctx->glsl_major;
    piVar9 = &ctx->glsl_minor;
    if (pGVar5 == (GLubyte *)0x0 || GVar4 == 0x500) {
      *piVar9 = 0;
      *piVar1 = 0;
    }
    else {
      pcVar6 = strstr((char *)pGVar5,"OpenGL ES GLSL ");
      lVar8 = 0xf;
      if (pcVar6 == (char *)0x0) {
        lVar8 = 0;
      }
      pcVar6 = strstr((char *)(pGVar5 + lVar8),"ES ");
      __isoc99_sscanf(pGVar5 + lVar8 + (ulong)(pcVar6 != (char *)0x0) * 3,"%d.%d",piVar1,piVar9);
    }
  }
  return;
}

Assistant:

static void load_extensions(MOJOSHADER_glGetProcAddress lookup, void *d)
{
    StringCache *exts = stringcache_create(ctx->malloc_fn, ctx->free_fn, ctx->malloc_data);
    if (!exts)
    {
        out_of_memory();
        return;
    } // if

    ctx->have_core_opengl = 1;
    ctx->have_opengl_2 = 1;
    ctx->have_opengl_3 = 1;
    ctx->have_GL_ARB_vertex_program = 1;
    ctx->have_GL_ARB_fragment_program = 1;
    ctx->have_GL_NV_vertex_program2_option = 1;
    ctx->have_GL_NV_fragment_program2 = 1;
    ctx->have_GL_NV_vertex_program3 = 1;
    ctx->have_GL_NV_gpu_program4 = 1;
    ctx->have_GL_ARB_shader_objects = 1;
    ctx->have_GL_ARB_vertex_shader = 1;
    ctx->have_GL_ARB_fragment_shader = 1;
    ctx->have_GL_ARB_shading_language_100 = 1;
    ctx->have_GL_NV_half_float = 1;
    ctx->have_GL_ARB_half_float_vertex = 1;
    ctx->have_GL_OES_vertex_half_float = 1;
    ctx->have_GL_ARB_instanced_arrays = 1;

    lookup_entry_points(lookup, d);

    if (!ctx->have_core_opengl)
        set_error("missing basic OpenGL entry points");
    else
    {
        const char *str = (const char *) ctx->glGetString(GL_VERSION);
        if (strstr(str, "OpenGL ES "))
        {
            ctx->have_opengl_es = 1;
            str += 10;
        }
        parse_opengl_version_str(str, &ctx->opengl_major, &ctx->opengl_minor);

        if ((ctx->have_opengl_3) && (opengl_version_atleast(3, 0)))
        {
            GLint i;
            GLint num_exts = 0;
            ctx->glGetIntegerv(GL_NUM_EXTENSIONS, &num_exts);
            for (i = 0; i < num_exts; i++)
            {
                if (!stringcache(exts, (const char *) ctx->glGetStringi(GL_EXTENSIONS, i)))
                    out_of_memory();
            } // for
        } // if
        else
        {
            const char *str = (const char *) ctx->glGetString(GL_EXTENSIONS);
            const char *ext;
            ctx->have_opengl_3 = 0;

            while (*str && iswhitespace(*str))
                str++;
            ext = str;

            while (1)
            {
                const char ch = *str;
                if (ch && (!iswhitespace(ch)))
                {
                    str++;
                    continue;
                } // else if

                if (str != ext)
                {
                    if (!stringcache_len(exts, ext, (unsigned int) (str - ext)))
                    {
                        out_of_memory();
                        break;
                    } // if
                } // if

                if (ch == '\0')
                    break;

                str++;
                while (*str && iswhitespace(*str))
                    str++;
                ext = str;
            } // while
        } // else
    } // else

    if ((ctx->have_opengl_2) && (!opengl_version_atleast(2, 0)))
    {
        ctx->have_opengl_2 = 0;  // Not GL2! must have the ARB extensions!

        // Force compatible ARB function pointers in...this keeps the code
        //  cleaner when they are identical, so we don't have to if/else
        //  every function call, but we definitely have the right entry
        //  point. Be careful what you add here.
        // These may be NULL, btw.
        ctx->glUniform1i = ctx->glUniform1iARB;
        ctx->glUniform4fv = ctx->glUniform4fvARB;
        ctx->glUniform4iv = ctx->glUniform4ivARB;
        ctx->glDisableVertexAttribArray = ctx->glDisableVertexAttribArrayARB;
        ctx->glEnableVertexAttribArray = ctx->glEnableVertexAttribArrayARB;
        ctx->glVertexAttribPointer = ctx->glVertexAttribPointerARB;
    } // if

    #define VERIFY_EXT(ext, major, minor) \
        ctx->have_##ext = verify_extension(#ext, ctx->have_##ext, exts, major, minor)

    VERIFY_EXT(GL_ARB_vertex_program, -1, -1);
    VERIFY_EXT(GL_ARB_fragment_program, -1, -1);
    VERIFY_EXT(GL_ARB_shader_objects, -1, -1);
    VERIFY_EXT(GL_ARB_vertex_shader, -1, -1);
    VERIFY_EXT(GL_ARB_fragment_shader, -1, -1);
    VERIFY_EXT(GL_ARB_shading_language_100, -1, -1);
    VERIFY_EXT(GL_NV_vertex_program2_option, -1, -1);
    VERIFY_EXT(GL_NV_fragment_program2, -1, -1);
    VERIFY_EXT(GL_NV_vertex_program3, -1, -1);
    VERIFY_EXT(GL_NV_half_float, -1, -1);
    VERIFY_EXT(GL_ARB_half_float_vertex, 3, 0);
    VERIFY_EXT(GL_OES_vertex_half_float, -1, -1);
    VERIFY_EXT(GL_ARB_instanced_arrays, 3, 3);

    #undef VERIFY_EXT

    stringcache_destroy(exts);

    detect_glsl_version();
}